

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O3

c_float quad_form(csc *P,c_float *x)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  if (P->n < 1) {
    return 0.0;
  }
  dVar5 = 0.0;
  lVar3 = 0;
  lVar4 = *P->p;
  do {
    lVar1 = P->p[lVar3 + 1];
    if (lVar4 < lVar1) {
      do {
        lVar2 = P->i[lVar4];
        if (lVar2 == lVar3) {
          dVar6 = P->x[lVar4] * 0.5 * x[lVar3] * x[lVar3];
        }
        else {
          if (lVar3 <= lVar2) {
            printf("ERROR in %s: ","quad_form");
            printf("quad_form matrix is not upper triangular");
            putchar(10);
            return 0.0;
          }
          dVar6 = P->x[lVar4] * x[lVar2] * x[lVar3];
        }
        dVar5 = dVar5 + dVar6;
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
    }
    lVar3 = lVar3 + 1;
    lVar4 = lVar1;
  } while (lVar3 != P->n);
  return dVar5;
}

Assistant:

c_float quad_form(const csc *P, const c_float *x) {
  c_float quad_form = 0.;
  c_int   i, j, ptr;                                // Pointers to iterate over
                                                    // matrix: (i,j) a element
                                                    // pointer

  for (j = 0; j < P->n; j++) {                      // Iterate over columns
    for (ptr = P->p[j]; ptr < P->p[j + 1]; ptr++) { // Iterate over rows
      i = P->i[ptr];                                // Row index

      if (i == j) {                                 // Diagonal element
        quad_form += (c_float).5 * P->x[ptr] * x[i] * x[i];
      }
      else if (i < j) {                             // Off-diagonal element
        quad_form += P->x[ptr] * x[i] * x[j];
      }
      else {                                        // Element in lower diagonal
                                                    // part
#ifdef PRINTING
        c_eprint("quad_form matrix is not upper triangular");
#endif /* ifdef PRINTING */
        return OSQP_NULL;
      }
    }
  }
  return quad_form;
}